

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

size_t svb_decode(uint32_t *out,uint8_t *in,int delta,int type)

{
  int iVar1;
  uint uVar2;
  uint32_t *out_00;
  uint8_t *puVar3;
  uint in_ECX;
  uint in_EDX;
  int *in_RSI;
  uint8_t *unaff_retaddr;
  uint8_t *dataPtr;
  uint32_t *in_stack_00000010;
  uint32_t keyLen;
  uint8_t *keyPtr;
  uint32_t count;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint64_t in_stack_fffffffffffffff8;
  size_t sVar4;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    sVar4 = 0;
  }
  else {
    out_00 = (uint32_t *)(in_RSI + 1);
    uVar2 = iVar1 + 3U >> 2;
    puVar3 = (uint8_t *)((long)out_00 + (ulong)uVar2);
    if ((in_EDX == 0) && (in_ECX == 1)) {
      puVar3 = svb_decode_scalar((uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                                 (uint8_t *)out_00,
                                 (uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                 (uint32_t)((ulong)puVar3 >> 0x20));
      sVar4 = (long)puVar3 - (long)in_RSI;
    }
    else if ((in_EDX == 1) && (in_ECX == 1)) {
      puVar3 = svb_decode_scalar_d1
                         (out_00,(uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),puVar3,
                          in_stack_ffffffffffffffbc);
      sVar4 = (long)puVar3 - (long)in_RSI;
    }
    else if ((in_EDX == 0) && (in_ECX == 5)) {
      puVar3 = svb_decode_avx_simple
                         (in_stack_00000010,dataPtr,unaff_retaddr,in_stack_fffffffffffffff8);
      sVar4 = (long)puVar3 - (long)in_RSI;
    }
    else {
      if ((in_EDX != 1) || (in_ECX != 5)) {
        printf("Unknown delta (%d) type (%d) combination.\n",(ulong)in_EDX,(ulong)in_ECX);
        abort();
      }
      puVar3 = svb_decode_avx_d1_simple
                         (out_00,(uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),puVar3,
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      sVar4 = (long)puVar3 - (long)in_RSI;
    }
  }
  return sVar4;
}

Assistant:

size_t svb_decode(uint32_t *out, uint8_t *in, int delta, int type) {
  uint32_t count = *(uint32_t *)in; // first 4 bytes is number of ints
  if (count == 0)
    return 0;

  uint8_t *keyPtr = in + 4;            // full list of keys is next
  uint32_t keyLen = ((count + 3) / 4); // 2-bits per key (rounded up)
  uint8_t *dataPtr = keyPtr + keyLen;  // data starts at end of keys

  if (delta == 0 && type == 1) {
    return svb_decode_scalar(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 1 && type == 1) {
    return svb_decode_scalar_d1(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 0 && type == 5) {
    return svb_decode_avx_simple(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 1 && type == 5) {
    return svb_decode_avx_d1_simple(out, keyPtr, dataPtr, count) - in;
  }

  printf("Unknown delta (%d) type (%d) combination.\n", delta, type);
  abort();
}